

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

Gia_Man_t * Gia_ManRemoveEnables2(Gia_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  uint local_64;
  int i;
  Gia_Obj_t *pNode;
  Gia_Obj_t *pThis;
  Gia_Obj_t *pFlopOut;
  Gia_Obj_t *pFlopIn;
  Gia_Obj_t *pObj1;
  Gia_Obj_t *pObj0;
  Gia_Obj_t *pObjC;
  Gia_Obj_t *pTemp;
  Gia_Man_t *pAux;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pNew = p;
  iVar2 = Gia_ManObjNum(p);
  pAux = Gia_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(pNew->pName);
  pAux->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pNew->pSpec);
  pAux->pSpec = pcVar4;
  Gia_ManHashAlloc(pAux);
  Gia_ManFillValue(pNew);
  pGVar5 = Gia_ManConst0(pNew);
  pGVar5->Value = 0;
  local_64 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pNew->vCis);
    bVar7 = false;
    if ((int)local_64 < iVar2) {
      pNode = Gia_ManCi(pNew,local_64);
      bVar7 = pNode != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ManAppendCi(pAux);
    pNode->Value = uVar3;
    local_64 = local_64 + 1;
  }
  local_64 = 0;
  while( true ) {
    bVar7 = false;
    if ((int)local_64 < pNew->nObjs) {
      pNode = Gia_ManObj(pNew,local_64);
      bVar7 = pNode != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjIsAnd(pNode);
    pGVar1 = pAux;
    if (iVar2 != 0) {
      iVar2 = Gia_ObjFanin0Copy(pNode);
      iLit1 = Gia_ObjFanin1Copy(pNode);
      uVar3 = Gia_ManHashAnd(pGVar1,iVar2,iLit1);
      pNode->Value = uVar3;
    }
    local_64 = local_64 + 1;
  }
  local_64 = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(pNew);
    bVar7 = false;
    if ((int)local_64 < iVar2) {
      pNode = Gia_ManCo(pNew,local_64);
      bVar7 = pNode != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar3 = Gia_ObjFanin0Copy(pNode);
    pNode->Value = uVar3;
    local_64 = local_64 + 1;
  }
  local_64 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(pNew);
    pGVar1 = pNew;
    bVar7 = false;
    if ((int)local_64 < iVar2) {
      iVar2 = Gia_ManPoNum(pNew);
      pFlopOut = Gia_ManCo(pGVar1,iVar2 + local_64);
      bVar7 = pFlopOut != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar5 = Gia_ObjFanin0(pFlopOut);
    iVar2 = Gia_ObjIsMuxType(pGVar5);
    if (iVar2 == 0) {
      printf("Cannot recognize enable of flop %d.\n",(ulong)local_64);
    }
    else {
      pObj0 = Gia_ObjRecognizeMux(pGVar5,&pFlopIn,&pObj1);
      pGVar5 = Gia_ObjRiToRo(pNew,pFlopOut);
      pGVar6 = Gia_Regular(pObj1);
      if ((pGVar6 == pGVar5) || (pGVar6 = Gia_Regular(pFlopIn), pGVar6 == pGVar5)) {
        iVar2 = Gia_ObjFaninC0(pFlopOut);
        if (iVar2 == 0) {
          pObj1 = Gia_Not(pObj1);
          pFlopIn = Gia_Not(pFlopIn);
        }
        iVar2 = Gia_IsComplement(pObj0);
        if (iVar2 != 0) {
          pObj0 = Gia_Not(pObj0);
          pGVar6 = pObj1;
          pObjC = pObj1;
          pObj1 = pFlopIn;
          pFlopIn = pGVar6;
        }
        pGVar6 = Gia_Regular(pObj1);
        if (pGVar6 == pGVar5) {
          pGVar5 = Gia_Regular(pFlopIn);
          uVar3 = pGVar5->Value;
          iVar2 = Gia_IsComplement(pFlopIn);
          uVar3 = Abc_LitNotCond(uVar3,(uint)((iVar2 != 0 ^ 0xffU) & 1));
          pFlopOut->Value = uVar3;
        }
        else {
          pGVar6 = Gia_Regular(pFlopIn);
          if (pGVar6 == pGVar5) {
            pGVar5 = Gia_Regular(pObj1);
            uVar3 = pGVar5->Value;
            iVar2 = Gia_IsComplement(pObj1);
            uVar3 = Abc_LitNotCond(uVar3,(uint)((iVar2 != 0 ^ 0xffU) & 1));
            pFlopOut->Value = uVar3;
          }
        }
      }
      else {
        printf("Cannot recognize self-loop of enable flop %d.\n",(ulong)local_64);
      }
    }
    local_64 = local_64 + 1;
  }
  local_64 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pNew->vCos);
    bVar7 = false;
    if ((int)local_64 < iVar2) {
      pNode = Gia_ManCo(pNew,local_64);
      bVar7 = pNode != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    Gia_ManAppendCo(pAux,pNode->Value);
    local_64 = local_64 + 1;
  }
  Gia_ManHashStop(pAux);
  pGVar1 = pAux;
  iVar2 = Gia_ManRegNum(pNew);
  Gia_ManSetRegNum(pGVar1,iVar2);
  pTemp = (Gia_Obj_t *)pAux;
  pAux = Gia_ManCleanup(pAux);
  Gia_ManStop((Gia_Man_t *)pTemp);
  return pAux;
}

Assistant:

Gia_Man_t * Gia_ManRemoveEnables2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pAux; 
    Gia_Obj_t * pTemp, * pObjC, * pObj0, * pObj1, * pFlopIn, * pFlopOut;
    Gia_Obj_t * pThis, * pNode;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pThis, i )
        pThis->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pThis, i )
        pThis->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pThis), Gia_ObjFanin1Copy(pThis) );
    Gia_ManForEachPo( p, pThis, i )
        pThis->Value = Gia_ObjFanin0Copy(pThis);
    Gia_ManForEachRi( p, pFlopIn, i )
    {
        pNode = Gia_ObjFanin0(pFlopIn);
        if ( !Gia_ObjIsMuxType(pNode) )
        {
            printf( "Cannot recognize enable of flop %d.\n", i );
            continue;
        }
        pObjC = Gia_ObjRecognizeMux( pNode, &pObj1, &pObj0 );
        pFlopOut = Gia_ObjRiToRo( p, pFlopIn );
        if ( Gia_Regular(pObj0) != pFlopOut && Gia_Regular(pObj1) != pFlopOut )
        {
            printf( "Cannot recognize self-loop of enable flop %d.\n", i );
            continue;
        }
        if ( !Gia_ObjFaninC0(pFlopIn) )
        {
            pObj0 = Gia_Not(pObj0);
            pObj1 = Gia_Not(pObj1);
        }
        if ( Gia_IsComplement(pObjC) )
        {
            pObjC = Gia_Not(pObjC);
            pTemp = pObj0;
            pObj0 = pObj1;
            pObj1 = pTemp;
        }
        if ( Gia_Regular(pObj0) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d0. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj0) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj1)->Value, !Gia_IsComplement(pObj1));
        }
        else if ( Gia_Regular(pObj1) == pFlopOut )
        {
//            printf( "FlopIn compl = %d. FlopOut is d1. Complement = %d.\n", 
//                Gia_ObjFaninC0(pFlopIn), Gia_IsComplement(pObj1) );
            pFlopIn->Value = Abc_LitNotCond(Gia_Regular(pObj0)->Value, !Gia_IsComplement(pObj0));
        }
    }
    Gia_ManForEachCo( p, pThis, i )
        Gia_ManAppendCo( pNew, pThis->Value );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pAux = pNew );
    Gia_ManStop( pAux );
    return pNew;
}